

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  char **ppcVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  byte *pbVar5;
  
  pbVar5 = (byte *)ptr;
LAB_001533b1:
  while( true ) {
    if (pbVar5 == (byte *)end) {
      return -1;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
    if ((ulong)bVar1 < 0xe) break;
switchD_001533d8_caseD_2:
    pbVar5 = pbVar5 + 1;
  }
  ppcVar4 = (char **)((long)&switchD_001533d8::switchdataD_001c8adc +
                     (long)(int)(&switchD_001533d8::switchdataD_001c8adc)[bVar1]);
  switch(bVar1) {
  case 0:
  case 1:
  case 8:
    break;
  default:
    goto switchD_001533d8_caseD_2;
  case 5:
    if ((long)end - (long)pbVar5 < 2) {
      return -2;
    }
    iVar2 = (*enc[3].scanners[2])(enc,(char *)pbVar5,ptr,ppcVar4);
    if (iVar2 == 0) {
      pbVar5 = pbVar5 + 2;
      ptr = extraout_RDX_00;
      goto LAB_001533b1;
    }
    break;
  case 6:
    if ((long)end - (long)pbVar5 < 3) {
      return -2;
    }
    iVar2 = (*enc[3].scanners[3])(enc,(char *)pbVar5,ptr,ppcVar4);
    if (iVar2 == 0) {
      pbVar5 = pbVar5 + 3;
      ptr = extraout_RDX_01;
      goto LAB_001533b1;
    }
    break;
  case 7:
    if ((long)end - (long)pbVar5 < 4) {
      return -2;
    }
    iVar2 = (*enc[3].literalScanners[0])(enc,(char *)pbVar5,ptr,ppcVar4);
    if (iVar2 == 0) {
      pbVar5 = pbVar5 + 4;
      ptr = extraout_RDX;
      goto LAB_001533b1;
    }
    break;
  case 0xc:
  case 0xd:
    goto switchD_001533d8_caseD_c;
  }
  *nextTokPtr = (char *)pbVar5;
  goto LAB_00153464;
switchD_001533d8_caseD_c:
  pbVar5 = pbVar5 + 1;
  if ((uint)bVar1 == open) {
    if (pbVar5 == (byte *)end) {
      iVar2 = -0x1b;
    }
    else {
      *nextTokPtr = (char *)pbVar5;
      uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
      if ((uVar3 < 0x1f) && ((0x40300e00U >> (uVar3 & 0x1f) & 1) != 0)) {
        iVar2 = 0x1b;
      }
      else {
LAB_00153464:
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  goto LAB_001533b1;
}

Assistant:

static
int PREFIX(scanLit)(int open, const ENCODING *enc,
                    const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  while (ptr != end) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (ptr == end)
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_CR: case BT_LF:
      case BT_GT: case BT_PERCNT: case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}